

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall
mjs::activation_object::activation_object
          (activation_object *this,global_object *global,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *param_names,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  char cVar1;
  version vVar2;
  gc_heap *h;
  pointer pbVar3;
  global_object *pgVar4;
  long *plVar5;
  long lVar6;
  gc_vector<mjs::activation_object::param> *this_00;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  string is;
  wstring_view local_90;
  object_ptr as;
  undefined1 local_68 [40];
  global_object *local_40;
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::activation_object::param>,_true> *local_38;
  
  (*(global->super_object)._vptr_object[0x13])(local_68,global,"Activation");
  local_40 = global;
  (*(global->super_object)._vptr_object[0xb])(&as,global);
  object::object(&this->super_object,(string *)local_68,&as);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&as.super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_68);
  (this->super_object)._vptr_object = (_func_int **)&PTR_get_001c70a8;
  this->arguments_ = 0;
  this->params_ = 0;
  if ((param_names->
      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (param_names->
      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    gc_vector<mjs::activation_object::param>::make
              ((gc_heap *)local_68,(uint32_t)(this->super_object).heap_);
    (this->params_).pos_ = local_68._8_4_;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_68);
  }
  pgVar4 = local_40;
  vVar2 = local_40->version_;
  if ((int)vVar2 < 2) {
    cVar1 = '\0';
  }
  else {
    cVar1 = *local_40->strict_mode_;
  }
  global_object::make_arguments_array((global_object *)&as);
  (this->arguments_).pos_ = as.super_gc_heap_ptr_untyped.pos_;
  plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&as);
  (*(pgVar4->super_object)._vptr_object[0x13])(&is,pgVar4,"length");
  lVar6 = ((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_start) / 0x28;
  auVar10._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar10._0_8_ = lVar6;
  auVar10._12_4_ = 0x45300000;
  local_68._8_8_ =
       (auVar10._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  local_68._0_4_ = 3;
  (**(code **)(*plVar5 + 8))(plVar5,&is,local_68,2);
  local_38 = &this->params_;
  value::~value((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&is);
  uVar8 = 0;
  while( true ) {
    uVar7 = (ulong)uVar8;
    lVar6 = (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    if ((ulong)(lVar6 / 0x28) <= uVar7) break;
    h = (this->super_object).heap_;
    index_string_abi_cxx11_((wstring *)local_68,(mjs *)(ulong)uVar8,(uint32_t)(lVar6 % 0x28));
    local_90._M_str = (wchar_t *)CONCAT44(local_68._4_4_,local_68._0_4_);
    local_90._M_len = local_68._8_8_;
    string::string(&is,h,&local_90);
    std::__cxx11::wstring::~wstring((wstring *)local_68);
    plVar5 = (long *)gc_heap_ptr_untyped::get(&as.super_gc_heap_ptr_untyped);
    (**(code **)(*plVar5 + 8))
              (plVar5,&is,
               (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
               super__Vector_impl_data._M_start + uVar7,((int)vVar2 < 2) * '\x02');
    pbVar3 = (param_names->
             super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar7 < (ulong)((long)(param_names->
                              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5)) {
      if (cVar1 == '\0') {
        this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::activation_object::param>,_true>::
                  dereference(local_38,(this->super_object).heap_);
        pbVar3 = (param_names->
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_90._M_str = pbVar3[uVar7]._M_dataplus._M_p;
        local_90._M_len = pbVar3[uVar7]._M_string_length;
        string::string((string *)local_68,(this->super_object).heap_,&local_90);
        gc_vector<mjs::activation_object::param>::emplace_back<mjs::string,mjs::string&>
                  (this_00,(string *)local_68,&is);
      }
      else {
        local_90._M_str = pbVar3[uVar7]._M_dataplus._M_p;
        local_90._M_len = pbVar3[uVar7]._M_string_length;
        string::string((string *)local_68,(this->super_object).heap_,&local_90);
        object::put(&this->super_object,(string *)local_68,
                    (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                    super__Vector_impl_data._M_start + uVar7,dont_delete);
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_68);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&is);
    uVar8 = uVar8 + 1;
  }
  (*(local_40->super_object)._vptr_object[0x13])(&is,local_40,"arguments");
  value::value((value *)local_68,&as);
  object::put(&this->super_object,&is,(value *)local_68,dont_delete);
  value::~value((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&is);
  if (cVar1 == '\0') {
    uVar7 = 0;
  }
  else {
    uVar7 = ((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                  super__Vector_impl_data._M_start) / 0x28;
  }
  uVar9 = uVar7 << 5 | 8;
  for (; pbVar3 = (param_names->
                  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(param_names->
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5);
      uVar7 = uVar7 + 1) {
    is.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ =
         *(undefined8 *)((long)pbVar3 + (uVar9 - 8));
    is.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         *(gc_heap **)((long)&(pbVar3->_M_dataplus)._M_p + uVar9);
    string::string((string *)local_68,(this->super_object).heap_,(wstring_view *)&is);
    object::put(&this->super_object,(string *)local_68,(value *)&value::undefined,dont_delete);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_68);
    uVar9 = uVar9 + 0x20;
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&as.super_gc_heap_ptr_untyped);
  return;
}

Assistant:

explicit activation_object(global_object& global, const std::vector<std::wstring>& param_names, const std::vector<value>& args)
        : object(global.common_string("Activation"), global.object_prototype()) {

        if (!param_names.empty()) {
            params_ = gc_vector<param>::make(heap(), static_cast<uint32_t>(param_names.size()));
        }

        const auto ver    = global.language_version();
        const bool strict = ver >= version::es5 && global.strict_mode();

        // Arguments array
        auto as = global.make_arguments_array();
        arguments_ = as;
        as->put(global.common_string("length"), value{static_cast<double>(args.size())}, property_attribute::dont_enum);
        for (uint32_t i = 0; i < args.size(); ++i) {
            string is{heap(), index_string(i)};
            as->put(is, args[i], ver >= version::es5 ? property_attribute::none : property_attribute::dont_enum);

            if (i < param_names.size()) {
                if (!strict) {
                    // Handle the (ugly) fact that the arguments array aliases the parameters
                    params_.dereference(heap()).emplace_back(string{heap(), param_names[i]}, is);
                } else {
                    object::put(string{heap(), param_names[i]}, args[i], property_attribute::dont_delete);
                }
            }
        }

        object::put(global.common_string("arguments"), value{as}, property_attribute::dont_delete);

        // Add placeholders (see note above)
        for (size_t i = strict ? args.size() : 0; i < param_names.size(); ++i) {
            object::put(string{heap(), param_names[i]}, value::undefined, property_attribute::dont_delete);
        }
    }